

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecFadds.c
# Opt level: O2

Vec_Int_t * Gia_ManCollectTruthTables(Gia_Man_t *p,Vec_Int_t *vFadds)

{
  int iVar1;
  int iVar2;
  Vec_Int_t *p_00;
  long lVar3;
  long lVar4;
  int iVar5;
  int Truth;
  int pCut [4];
  
  pCut[0] = 3;
  pCut[1] = 0;
  pCut[2] = 0;
  pCut[3] = 0;
  p_00 = Vec_IntAlloc((vFadds->nSize * 2) / 5);
  Gia_ManCleanValue(p);
  iVar5 = 0;
  lVar3 = 0;
  while( true ) {
    if (vFadds->nSize / 5 <= lVar3) {
      return p_00;
    }
    iVar2 = (int)lVar3 * 5;
    for (lVar4 = 0; lVar4 != 3; lVar4 = lVar4 + 1) {
      iVar1 = Vec_IntEntry(vFadds,iVar5 + (int)lVar4);
      pCut[lVar4 + 1] = iVar1;
    }
    iVar1 = Vec_IntEntry(vFadds,iVar2 + 3);
    iVar1 = Dtc_ObjComputeTruth(p,iVar1,pCut,&Truth);
    if (iVar1 != 1) break;
    Vec_IntPush(p_00,Truth);
    iVar2 = Vec_IntEntry(vFadds,iVar2 + 4);
    iVar2 = Dtc_ObjComputeTruth(p,iVar2,pCut,&Truth);
    if (iVar2 != 2) {
      __assert_fail("Type == 2",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/acec/acecFadds.c"
                    ,0x262,"Vec_Int_t *Gia_ManCollectTruthTables(Gia_Man_t *, Vec_Int_t *)");
    }
    Vec_IntPush(p_00,Truth);
    lVar3 = lVar3 + 1;
    iVar5 = iVar5 + 5;
  }
  __assert_fail("Type == 1",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/acec/acecFadds.c"
                ,0x25f,"Vec_Int_t *Gia_ManCollectTruthTables(Gia_Man_t *, Vec_Int_t *)");
}

Assistant:

Vec_Int_t * Gia_ManCollectTruthTables( Gia_Man_t * p, Vec_Int_t * vFadds )
{
    int i, k, Type, Truth, pCut[4] = {3};
    Vec_Int_t * vTruths = Vec_IntAlloc( 2*Vec_IntSize(vFadds)/5 );
    Gia_ManCleanValue( p );
    Dtc_ForEachFadd( vFadds, i )
    {
        for ( k = 0; k < 3; k++ )
            pCut[k+1] = Vec_IntEntry( vFadds, 5*i+k );
        Type = Dtc_ObjComputeTruth( p, Vec_IntEntry(vFadds, 5*i+3), pCut, &Truth );
        assert( Type == 1 );
        Vec_IntPush( vTruths, Truth );
        Type = Dtc_ObjComputeTruth( p, Vec_IntEntry(vFadds, 5*i+4), pCut, &Truth );
        assert( Type == 2 );
        Vec_IntPush( vTruths, Truth );
    }
    return vTruths;
}